

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O1

void * strbuf_append(strbuf *buf_o,size_t len)

{
  size_t sVar1;
  uchar *puVar2;
  size_t sVar3;
  
  puVar2 = (uchar *)safegrowarray(buf_o->s,(size_t *)&buf_o[-1].binarysink_[0].binarysink_,1,
                                  buf_o->len + 1,len,*(_Bool *)&buf_o[1].s);
  buf_o->s = (char *)puVar2;
  buf_o->u = puVar2;
  sVar1 = buf_o->len;
  sVar3 = sVar1 + len;
  buf_o->len = sVar3;
  puVar2[sVar3] = '\0';
  return puVar2 + sVar1;
}

Assistant:

void *strbuf_append(strbuf *buf_o, size_t len)
{
    struct strbuf_impl *buf = container_of(buf_o, struct strbuf_impl, visible);
    char *toret;
    sgrowarray_general(
        buf->visible.s, buf->size, buf->visible.len + 1, len, buf->nm);
    STRBUF_SET_UPTR(buf);
    toret = buf->visible.s + buf->visible.len;
    buf->visible.len += len;
    buf->visible.s[buf->visible.len] = '\0';
    return toret;
}